

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.h
# Opt level: O0

void __thiscall KeyStore::KeyStore(KeyStore *this)

{
  KeyStore *this_local;
  
  asn1::MemBuffer::MemBuffer(&this->membuf,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->certificate);
  std::__cxx11::string::string((string *)&this->currentKeyName);
  std::__cxx11::string::string((string *)&this->currentKeyPass);
  return;
}

Assistant:

KeyStore() {}